

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O1

void test_find(CuTest *tc)

{
  _Bool _Var1;
  int i;
  selist *il;
  selist *ql;
  int local_44;
  selist *local_40;
  selist *local_38;
  
  local_38 = (selist *)0x0;
  selist_push(&local_38,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  selist_push(&local_38,
              "orem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  selist_push(&local_38,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  local_40 = local_38;
  local_44 = 0;
  _Var1 = selist_find(&local_40,&local_44,
                      "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
                      ,(_func_int_void_ptr_void_ptr *)0x0);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x62,"assert failed",(uint)_Var1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             99,(char *)0x0,0,local_44);
  selist_advance(&local_40,&local_44,1);
  _Var1 = selist_find(&local_40,&local_44,
                      "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
                      ,(_func_int_void_ptr_void_ptr *)0x0);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x66,"assert failed",(uint)_Var1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x67,(char *)0x0,2,local_44);
  selist_advance(&local_40,&local_44,1);
  _Var1 = selist_find(&local_40,&local_44,
                      "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
                      ,(_func_int_void_ptr_void_ptr *)0x0);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x6a,"assert failed",(uint)!_Var1);
  selist_free(local_38);
  return;
}

Assistant:

static void test_find(CuTest *tc) {
    struct selist *ql = NULL;
    struct selist *il;
    int i;

    selist_push(&ql, (void *)lipsum);
    selist_push(&ql, (void *)(lipsum + 1));
    selist_push(&ql, (void *)lipsum);

    il = ql; i = 0;
    CuAssertTrue(tc, selist_find(&il, &i, (void *)lipsum, 0));
    CuAssertIntEquals(tc, 0, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, selist_find(&il, &i, (void *)lipsum, 0));
    CuAssertIntEquals(tc, 2, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, !selist_find(&il, &i, (void *)lipsum, 0));
    selist_free(ql);
}